

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(defV *data,Time *val)

{
  pointer pcVar1;
  helics *this;
  pointer pdVar2;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *this_00;
  size_type sVar4;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  TimeRepresentation<count_time<9,_long>_> TVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  double t;
  string_view timeString;
  string_view val_00;
  string_view val_01;
  size_t index;
  
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    pvVar3 = (variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
              *)std::
                get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
    break;
  default:
    pvVar5 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    TVar8.internalTimeCode = *pvVar5;
    goto LAB_001c4a92;
  case '\x02':
    pvVar6 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    TVar8.internalTimeCode = std::__cxx11::stoll(pvVar6,&index,10);
    if ((index != 0xffffffffffffffff) && (index != pvVar6->_M_string_length)) {
      pvVar6 = std::
               get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         (data);
      timeString._M_str = extraout_RDX_00;
      timeString._M_len = (size_t)(pvVar6->_M_dataplus)._M_p;
      TVar8 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                        ((utilities *)pvVar6->_M_string_length,timeString);
    }
    goto LAB_001c4a92;
  case '\x03':
    pvVar3 = std::
             get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    break;
  case '\x04':
    pvVar7 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    goto LAB_001c4a80;
  case '\x05':
    pvVar7 = (variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
              *)std::
                get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
LAB_001c4a80:
    pdVar2 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar2 == (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      TVar8.internalTimeCode = 0;
      goto LAB_001c4a92;
    }
    t = *pdVar2;
    goto LAB_001c4a8d;
  case '\x06':
    this_00 = std::
              get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        (data);
    t = this_00->value;
    if (NAN(t)) {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00,".[eE",0);
      pcVar1 = (this_00->name)._M_dataplus._M_p;
      this = (helics *)(this_00->name)._M_string_length;
      if (sVar4 == 0xffffffffffffffff) {
        val_00._M_str = extraout_RDX;
        val_00._M_len = (size_t)pcVar1;
        TVar8.internalTimeCode = getIntFromString(this,val_00);
        goto LAB_001c4a92;
      }
      val_01._M_str = pcVar1;
      val_01._M_len = (size_t)this;
      t = getDoubleFromString(val_01);
    }
    goto LAB_001c4a8d;
  }
  t = *(double *)pvVar3->_M_value;
LAB_001c4a8d:
  TVar8.internalTimeCode = count_time<9,_long>::convert(t);
LAB_001c4a92:
  val->internalTimeCode = TVar8.internalTimeCode;
  return;
}

Assistant:

void valueExtract(const defV& data, Time& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::get<double>(data);
            break;
        case int_loc:  // int64_t
        default:
            val.setBaseTimeCode(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        {
            size_t index;
            const auto& str = std::get<std::string>(data);
            try {
                auto timeCodeValue = std::stoll(str, &index);
                if ((index == std::string::npos) || (index == str.size())) {
                    val.setBaseTimeCode(timeCodeValue);
                } else {
                    val = gmlc::utilities::loadTimeFromString<helics::Time>(
                        std::get<std::string>(data));
                }
            }
            catch (...) {
                val = timeZero;
            }
            break;
        }
        case complex_loc:  // complex
            val = std::get<std::complex<double>>(data).real();
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val = (!vec.empty()) ? Time(vec[0]) : timeZero;
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            val = (!vec.empty()) ? Time(vec[0].real()) : timeZero;
            break;
        }
        case named_point_loc:
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                if (point.name.find(".[eE") == std::string::npos) {
                    const std::int64_t intVal = getIntFromString(point.name);
                    val.setBaseTimeCode(intVal);
                } else {
                    val = getDoubleFromString(point.name);
                }
            } else {
                val = point.value;
            }
            break;
    }
}